

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.c
# Opt level: O1

void nn_fsm_init_root(nn_fsm *self,nn_fsm_fn fn,nn_fsm_fn shutdown_fn,nn_ctx *ctx)

{
  self->fn = fn;
  self->shutdown_fn = shutdown_fn;
  self->state = 1;
  self->src = -1;
  self->srcptr = (void *)0x0;
  self->owner = (nn_fsm *)0x0;
  self->ctx = ctx;
  (self->stopped).fsm = (nn_fsm *)0x0;
  (self->stopped).src = -1;
  (self->stopped).srcptr = (void *)0x0;
  (self->stopped).type = -1;
  nn_queue_item_init(&(self->stopped).item);
  return;
}

Assistant:

void nn_fsm_init_root (struct nn_fsm *self, nn_fsm_fn fn,
    nn_fsm_fn shutdown_fn, struct nn_ctx *ctx)
{
    self->fn = fn;
    self->shutdown_fn = shutdown_fn;
    self->state = NN_FSM_STATE_IDLE;
    self->src = -1;
    self->srcptr = NULL;
    self->owner = NULL;
    self->ctx = ctx;
    nn_fsm_event_init (&self->stopped);
}